

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SccLiveness.cpp
# Opt level: O3

uint __thiscall OpHelperBlock::Length(OpHelperBlock *this)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  uint32 uVar4;
  undefined4 *puVar5;
  Instr *this_00;
  
  if (this->opHelperLabel == (LabelInstr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/SccLiveness.cpp"
                       ,0x396,"(opHelperLabel)","opHelperLabel");
    if (!bVar2) goto LAB_00621ca1;
    *puVar5 = 0;
  }
  this_00 = this->opHelperEndInstr;
  if (this_00 == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/SccLiveness.cpp"
                       ,0x397,"(opHelperEndInstr)","opHelperEndInstr");
    if (!bVar2) {
LAB_00621ca1:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
    this_00 = this->opHelperEndInstr;
  }
  uVar3 = IR::Instr::GetNumber(this_00);
  uVar4 = IR::Instr::GetNumber(&this->opHelperLabel->super_Instr);
  return ((uVar3 - uVar4) + 1) -
         (uint)((this->opHelperEndInstr->m_kind - InstrKindLabel & 0xfd) == 0);
}

Assistant:

uint OpHelperBlock::Length() const
{
    Assert(opHelperLabel);
    Assert(opHelperEndInstr);

    uint length = opHelperEndInstr->GetNumber() - opHelperLabel->GetNumber();
    if(!opHelperEndInstr->IsLabelInstr())
    {
        ++length;
    }
    return length;
}